

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O3

ostream * operator<<(ostream *out,ProtocolARP *obj)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  ARPCacheEntry *pAVar3;
  int iVar4;
  long lVar5;
  string s;
  stringstream ss;
  string local_200;
  long *local_1e0;
  int local_1d8;
  undefined4 uStack_1d4;
  long local_1d0 [2];
  long local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"ARP Cache (ostream):\n",0x15);
  paVar1 = &local_200.field_2;
  lVar5 = 0;
  do {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar2 = (ostream *)std::ostream::operator<<(local_1a8,(uint)obj->Cache[lVar5].IPv4Address[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
    pAVar3 = obj->Cache + lVar5;
    poVar2 = (ostream *)std::ostream::operator<<(local_1a8,(uint)pAVar3->IPv4Address[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
    poVar2 = (ostream *)std::ostream::operator<<(local_1a8,(uint)pAVar3->IPv4Address[2]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
    std::ostream::operator<<(local_1a8,(uint)pAVar3->IPv4Address[3]);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>(out,"   ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,(char *)local_1e0,CONCAT44(uStack_1d4,local_1d8));
    local_1c0 = lVar5;
    if (local_1d8 < 0x13) {
      iVar4 = local_1d8 + -0x13;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0);
    }
    to_hex<unsigned_char>(&local_200,pAVar3->MACAddress[0],2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_200._M_dataplus._M_p,local_200._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar1) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    to_hex<unsigned_char>(&local_200,pAVar3->MACAddress[1],2);
    lVar5 = local_1c0;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_200._M_dataplus._M_p,local_200._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar1) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    to_hex<unsigned_char>(&local_200,pAVar3->MACAddress[2],2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_200._M_dataplus._M_p,local_200._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar1) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    to_hex<unsigned_char>(&local_200,pAVar3->MACAddress[3],2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_200._M_dataplus._M_p,local_200._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar1) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    to_hex<unsigned_char>(&local_200,pAVar3->MACAddress[4],2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_200._M_dataplus._M_p,local_200._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar1) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    to_hex<unsigned_char>(&local_200,pAVar3->MACAddress[5],2);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_200._M_dataplus._M_p,local_200._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar1) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"   age = ",9);
    poVar2 = (ostream *)std::ostream::operator<<(out,(uint)pAVar3->Age);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ProtocolARP& obj)
{
    out << "ARP Cache (ostream):\n";
    for (int i = 0; i < ARPCacheSize; i++)
    {
        std::stringstream ss;
        ss << (int)obj.Cache[i].IPv4Address[0] << ".";
        ss << (int)obj.Cache[i].IPv4Address[1] << ".";
        ss << (int)obj.Cache[i].IPv4Address[2] << ".";
        ss << (int)obj.Cache[i].IPv4Address[3];
        std::string s = ss.str();

        out << "   " << s;
        for (int length = s.size(); length < 19; length++)
        {
            out << " ";
        }
        out << to_hex(obj.Cache[i].MACAddress[0]) << ":";
        out << to_hex(obj.Cache[i].MACAddress[1]) << ":";
        out << to_hex(obj.Cache[i].MACAddress[2]) << ":";
        out << to_hex(obj.Cache[i].MACAddress[3]) << ":";
        out << to_hex(obj.Cache[i].MACAddress[4]) << ":";
        out << to_hex(obj.Cache[i].MACAddress[5]);
        out << "   age = " << (int)obj.Cache[i].Age << "\n";
    }
    return out;
}